

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudotopoorder.cpp
# Opt level: O3

void __thiscall PseudoTopoOrder::apply(PseudoTopoOrder *this,Path *P,int u,int v)

{
  int iVar1;
  _Elt_pointer pNVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  iterator iVar6;
  ulong uVar7;
  pointer piVar8;
  int iVar9;
  _Elt_pointer pNVar10;
  int *piVar11;
  _Elt_pointer pNVar12;
  _Map_pointer ppNVar13;
  vector<int,_std::allocator<int>_> indexesofPbetweenuandv;
  int index;
  vector<int,_std::allocator<int>_> nodesofPbetweenuandv;
  int *local_78;
  iterator iStack_70;
  int *local_68;
  PseudoTopoOrder *local_58;
  int local_50;
  int local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  local_78 = (int *)0x0;
  iStack_70._M_current = (int *)0x0;
  local_68 = (int *)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  pNVar12 = (P->m_path).super__Deque_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pNVar2 = (P->m_path).super__Deque_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pNVar12 != pNVar2) {
    pNVar10 = (P->m_path).super__Deque_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppNVar13 = (P->m_path).super__Deque_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    local_58 = this;
    do {
      iVar9 = (*pNVar12).node;
      local_4c = (local_58->pto_inverse).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar9];
      if (local_4c < v && u <= local_4c) {
        if (iStack_70._M_current == local_68) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_4c);
        }
        else {
          *iStack_70._M_current = local_4c;
          iStack_70._M_current = iStack_70._M_current + 1;
        }
        local_50 = iVar9;
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_48,
                     (iterator)
                     local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          *local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar9;
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      iVar6._M_current = iStack_70._M_current;
      piVar11 = local_78;
      pNVar12 = pNVar12 + 1;
      if (pNVar12 == pNVar10) {
        pNVar12 = ppNVar13[1];
        ppNVar13 = ppNVar13 + 1;
        pNVar10 = pNVar12 + 0x40;
      }
    } while (pNVar12 != pNVar2);
    this = local_58;
    if (local_78 != iStack_70._M_current) {
      uVar7 = (long)iStack_70._M_current - (long)local_78 >> 2;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_78,iStack_70._M_current,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      this = local_58;
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar11,iVar6._M_current);
    }
  }
  if (local_78 != iStack_70._M_current) {
    piVar3 = (this->pto).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->pto_inverse).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar11 = local_78;
    do {
      iVar9 = *piVar11;
      iVar1 = *piVar8;
      piVar3[iVar9] = iVar1;
      piVar4[iVar1] = iVar9;
      piVar11 = piVar11 + 1;
      piVar8 = piVar8 + 1;
    } while (piVar11 != iStack_70._M_current);
  }
  if (u < this->first_unknown) {
    this->first_unknown = u;
  }
  this->path_filled = false;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78 != (int *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return;
}

Assistant:

void PseudoTopoOrder::apply(const Path& P, int u, int v)
{
// 	cout << "Before applying Q, we get: " << Value() << endl;

	std::vector<int> indexesofPbetweenuandv;
	std::vector<int> nodesofPbetweenuandv;

	for (auto x : P.get_path())
	{
		int index = pto_inverse[x];

		if (u <= index && index < v)
		{
			indexesofPbetweenuandv.push_back(index);
			nodesofPbetweenuandv.push_back(x);
// 			cout << "found " << x << " at " << index << endl;
		}
	}

	sort(indexesofPbetweenuandv.begin(), indexesofPbetweenuandv.end());
	int i = 0;

	for (auto p : indexesofPbetweenuandv)
	{
		pto[p] = nodesofPbetweenuandv[i];
		pto_inverse[pto[p]] = p;
		++i;
	}

// 	AnnounceModification(indexesofPbetweenuandv[0]);
	AnnounceModification(u);
// 	cout << "After applying Q, we get: " << Value() << endl;
}